

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

string * __thiscall
FastPForLib::FastPFor<8u>::name_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  allocator local_49;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_28;
  
  std::__cxx11::string::string((string *)&local_28,"FastPFor",&local_49);
  std::__cxx11::to_string(&local_48,0x100);
  std::operator+(__return_storage_ptr__,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

std::string name() const override {
    return std::string("FastPFor") + std::to_string(BlockSize);
  }